

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::reporters::Reporter_testLoggingReporter_Test::TestBody
          (Reporter_testLoggingReporter_Test *this)

{
  int iVar1;
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  logger;
  LoggingReporter reporter;
  long *local_30;
  undefined *local_28 [2];
  
  jaegertracing::logging::nullLogger();
  local_28[0] = &thrift::Span::vtable;
  iVar1 = 100;
  do {
    jaegertracing::reporters::LoggingReporter::report((Span *)local_28);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  return;
}

Assistant:

TEST(Reporter, testLoggingReporter)
{
    const auto logger = logging::nullLogger();
    LoggingReporter reporter(*logger);
    constexpr auto kNumReports = 100;
    for (auto i = 0; i < kNumReports; ++i) {
        reporter.report(span);
    }
    reporter.close();
}